

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_write_binary_le(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  size_t sVar1;
  ulong uVar2;
  ulong local_40;
  size_t i;
  size_t bytes_to_copy;
  size_t stored_bytes;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_mpi *X_local;
  
  sVar1 = X->n;
  uVar2 = sVar1 * 8;
  local_40 = buflen;
  i = uVar2;
  if (buflen <= uVar2) {
    for (; i = buflen, local_40 < uVar2; local_40 = local_40 + 1) {
      if ((*(ulong *)((long)X->p + (local_40 & 0xfffffffffffffff8)) >> (sbyte)((local_40 & 7) << 3)
          & 0xff) != 0) {
        return -8;
      }
    }
  }
  for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
    buf[local_40] =
         (uchar)(*(ulong *)((long)X->p + (local_40 & 0xfffffffffffffff8)) >>
                (sbyte)((local_40 & 7) << 3));
  }
  if (uVar2 < buflen) {
    memset(buf + uVar2,0,buflen + sVar1 * -8);
  }
  return 0;
}

Assistant:

int mbedtls_mpi_write_binary_le( const mbedtls_mpi *X,
                                 unsigned char *buf, size_t buflen )
{
    size_t stored_bytes = X->n * ciL;
    size_t bytes_to_copy;
    size_t i;

    if( stored_bytes < buflen )
    {
        bytes_to_copy = stored_bytes;
    }
    else
    {
        bytes_to_copy = buflen;

        /* The output buffer is smaller than the allocated size of X.
         * However X may fit if its leading bytes are zero. */
        for( i = bytes_to_copy; i < stored_bytes; i++ )
        {
            if( GET_BYTE( X, i ) != 0 )
                return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
        }
    }

    for( i = 0; i < bytes_to_copy; i++ )
        buf[i] = GET_BYTE( X, i );

    if( stored_bytes < buflen )
    {
        /* Write trailing 0 bytes */
        memset( buf + stored_bytes, 0, buflen - stored_bytes );
    }

    return( 0 );
}